

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::CPPinclude(TPpContext *this,TPpToken *ppToken)

{
  TParseContextBase *pTVar1;
  Includer *pIVar2;
  TIntermediate *this_00;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_type sVar8;
  undefined4 extraout_var;
  ulong uVar9;
  undefined4 extraout_var_00;
  ostream *poVar10;
  TokenizableIncludeFile *this_01;
  allocator<char> local_3f3;
  byte local_3f2;
  allocator local_3f1;
  string local_3f0 [8];
  string message;
  string local_3b0;
  string local_390;
  ostringstream local_370 [8];
  ostringstream epilogue;
  ostringstream local_1f8 [8];
  ostringstream prologue;
  IncludeResult *pIStack_78;
  bool forNextLine;
  IncludeResult *res;
  string local_68 [8];
  string filename;
  int local_40;
  int ch;
  int token;
  bool startWithLocalSearch;
  TSourceLoc directiveLoc;
  TPpToken *ppToken_local;
  TPpContext *this_local;
  
  _token = (ppToken->loc).name;
  directiveLoc.name = *(TString **)&(ppToken->loc).string;
  directiveLoc.string = (ppToken->loc).column;
  directiveLoc.line = *(int *)&(ppToken->loc).field_0x14;
  bVar3 = true;
  directiveLoc._16_8_ = ppToken;
  filename.field_2._12_4_ = getChar(this);
  while (filename.field_2._12_4_ == 0x20 || filename.field_2._12_4_ == 9) {
    filename.field_2._12_4_ = getChar(this);
  }
  if (filename.field_2._12_4_ == 0x3c) {
    bVar3 = false;
    local_40 = scanHeaderName(this,(TPpToken *)directiveLoc._16_8_,'>');
  }
  else if (filename.field_2._12_4_ == 0x22) {
    local_40 = scanHeaderName(this,(TPpToken *)directiveLoc._16_8_,'\"');
  }
  else {
    ungetChar(this);
    local_40 = scanToken(this,(TPpToken *)directiveLoc._16_8_);
  }
  if (local_40 == 0xa1) {
    pcVar5 = (char *)(directiveLoc._16_8_ + 0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_68,pcVar5,(allocator<char> *)((long)&res + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&res + 7));
    this_local._4_4_ = scanToken(this,(TPpToken *)directiveLoc._16_8_);
    uVar7 = directiveLoc._16_8_;
    if (this_local._4_4_ == 10) {
      pIStack_78 = (IncludeResult *)0x0;
      if (bVar3) {
        pIVar2 = this->includer;
        uVar7 = std::__cxx11::string::c_str();
        uVar6 = std::__cxx11::string::c_str();
        sVar8 = std::
                stack<glslang::TShader::Includer::IncludeResult_*,_std::deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>_>
                ::size(&this->includeStack);
        iVar4 = (*pIVar2->_vptr_Includer[1])(pIVar2,uVar7,uVar6,sVar8 + 1);
        pIStack_78 = (IncludeResult *)CONCAT44(extraout_var,iVar4);
      }
      if ((pIStack_78 == (IncludeResult *)0x0) ||
         (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
        (*this->includer->_vptr_Includer[2])(this->includer,pIStack_78);
        pIVar2 = this->includer;
        uVar7 = std::__cxx11::string::c_str();
        uVar6 = std::__cxx11::string::c_str();
        sVar8 = std::
                stack<glslang::TShader::Includer::IncludeResult_*,_std::deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>_>
                ::size(&this->includeStack);
        iVar4 = (**pIVar2->_vptr_Includer)(pIVar2,uVar7,uVar6,sVar8 + 1);
        pIStack_78 = (IncludeResult *)CONCAT44(extraout_var_00,iVar4);
      }
      if ((pIStack_78 == (IncludeResult *)0x0) ||
         (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
        local_3f2 = 0;
        if (pIStack_78 == (IncludeResult *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_3f0,"Could not process include directive",&local_3f3);
          std::allocator<char>::~allocator(&local_3f3);
        }
        else {
          pcVar5 = pIStack_78->headerData;
          uVar9 = pIStack_78->headerLength;
          std::allocator<char>::allocator();
          local_3f2 = 1;
          std::__cxx11::string::string(local_3f0,pcVar5,uVar9,&local_3f1);
        }
        if ((local_3f2 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        }
        pTVar1 = this->parseContext;
        uVar7 = std::__cxx11::string::c_str();
        uVar6 = std::__cxx11::string::c_str();
        (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2f])
                  (pTVar1,&token,uVar7,"#include","for header name: %s",uVar6);
        (*this->includer->_vptr_Includer[2])(this->includer,pIStack_78);
        std::__cxx11::string::~string(local_3f0);
      }
      else if ((pIStack_78->headerData == (char *)0x0) || (pIStack_78->headerLength == 0)) {
        (*this->includer->_vptr_Includer[2])(this->includer,pIStack_78);
      }
      else {
        iVar4 = (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x39])();
        bVar3 = (bool)((byte)iVar4 & 1);
        std::__cxx11::ostringstream::ostringstream(local_1f8);
        std::__cxx11::ostringstream::ostringstream(local_370);
        poVar10 = std::operator<<((ostream *)local_1f8,"#line ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,bVar3);
        poVar10 = std::operator<<(poVar10," ");
        poVar10 = std::operator<<(poVar10,"\"");
        poVar10 = std::operator<<(poVar10,(string *)pIStack_78);
        std::operator<<(poVar10,"\"\n");
        pcVar5 = "\n";
        if (pIStack_78->headerData[pIStack_78->headerLength - 1] == '\n') {
          pcVar5 = "";
        }
        poVar10 = std::operator<<((ostream *)local_370,pcVar5);
        poVar10 = std::operator<<(poVar10,"#line ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,directiveLoc.name._4_4_ + (uint)bVar3)
        ;
        poVar10 = std::operator<<(poVar10," ");
        TSourceLoc::getStringNameOrNum_abi_cxx11_(&local_390,(TSourceLoc *)&token,true);
        poVar10 = std::operator<<(poVar10,(string *)&local_390);
        std::operator<<(poVar10,"\n");
        std::__cxx11::string::~string((string *)&local_390);
        this_01 = (TokenizableIncludeFile *)::operator_new(0x118);
        std::__cxx11::ostringstream::str();
        std::__cxx11::ostringstream::str();
        TokenizableIncludeFile::TokenizableIncludeFile
                  (this_01,(TSourceLoc *)&token,&local_3b0,pIStack_78,
                   (string *)((long)&message.field_2 + 8),this);
        pushInput(this,(tInput *)this_01);
        std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_3b0);
        this_00 = (this->parseContext->super_TParseVersions).intermediate;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        TIntermediate::addIncludeText
                  (this_00,pcVar5,pIStack_78->headerData,pIStack_78->headerLength);
        TParseVersions::setCurrentColumn(&this->parseContext->super_TParseVersions,0);
        std::__cxx11::ostringstream::~ostringstream(local_370);
        std::__cxx11::ostringstream::~ostringstream(local_1f8);
      }
    }
    else if (this_local._4_4_ == -1) {
      pTVar1 = this->parseContext;
      uVar6 = std::__cxx11::string::c_str();
      (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (pTVar1,uVar7,"expected newline after header name:","#include","%s",uVar6);
    }
    else {
      pTVar1 = this->parseContext;
      uVar6 = std::__cxx11::string::c_str();
      (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (pTVar1,uVar7,"extra content after header name:","#include","%s",uVar6);
    }
    res._0_4_ = 1;
    std::__cxx11::string::~string(local_68);
  }
  else {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,&token,"must be followed by a header name","#include","");
    this_local._4_4_ = local_40;
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::CPPinclude(TPpToken* ppToken)
{
    const TSourceLoc directiveLoc = ppToken->loc;
    bool startWithLocalSearch = true; // to additionally include the extra "" paths
    int token;

    // Find the first non-whitespace char after #include
    int ch = getChar();
    while (ch == ' ' || ch == '\t') {
        ch = getChar();
    }
    if (ch == '<') {
        // <header-name> style
        startWithLocalSearch = false;
        token = scanHeaderName(ppToken, '>');
    } else if (ch == '"') {
        // "header-name" style
        token = scanHeaderName(ppToken, '"');
    } else {
        // unexpected, get the full token to generate the error
        ungetChar();
        token = scanToken(ppToken);
    }

    if (token != PpAtomConstString) {
        parseContext.ppError(directiveLoc, "must be followed by a header name", "#include", "");
        return token;
    }

    // Make a copy of the name because it will be overwritten by the next token scan.
    const std::string filename = ppToken->name;

    // See if the directive was well formed
    token = scanToken(ppToken);
    if (token != '\n') {
        if (token == EndOfInput)
            parseContext.ppError(ppToken->loc, "expected newline after header name:", "#include", "%s", filename.c_str());
        else
            parseContext.ppError(ppToken->loc, "extra content after header name:", "#include", "%s", filename.c_str());
        return token;
    }

    // Process well-formed directive

    // Find the inclusion, first look in "Local" ("") paths, if requested,
    // otherwise, only search the "System" (<>) paths.
    TShader::Includer::IncludeResult* res = nullptr;
    if (startWithLocalSearch)
        res = includer.includeLocal(filename.c_str(), currentSourceFile.c_str(), includeStack.size() + 1);
    if (res == nullptr || res->headerName.empty()) {
        includer.releaseInclude(res);
        res = includer.includeSystem(filename.c_str(), currentSourceFile.c_str(), includeStack.size() + 1);
    }

    // Process the results
    if (res != nullptr && !res->headerName.empty()) {
        if (res->headerData != nullptr && res->headerLength > 0) {
            // path for processing one or more tokens from an included header, hand off 'res'
            const bool forNextLine = parseContext.lineDirectiveShouldSetNextLine();
            std::ostringstream prologue;
            std::ostringstream epilogue;
            prologue << "#line " << forNextLine << " " << "\"" << res->headerName << "\"\n";
            epilogue << (res->headerData[res->headerLength - 1] == '\n'? "" : "\n") <<
                "#line " << directiveLoc.line + forNextLine << " " << directiveLoc.getStringNameOrNum() << "\n";
            pushInput(new TokenizableIncludeFile(directiveLoc, prologue.str(), res, epilogue.str(), this));
            parseContext.intermediate.addIncludeText(res->headerName.c_str(), res->headerData, res->headerLength);
            // There's no "current" location anymore.
            parseContext.setCurrentColumn(0);
        } else {
            // things are okay, but there is nothing to process
            includer.releaseInclude(res);
        }
    } else {
        // error path, clean up
        std::string message =
            res != nullptr ? std::string(res->headerData, res->headerLength)
                           : std::string("Could not process include directive");
        parseContext.ppError(directiveLoc, message.c_str(), "#include", "for header name: %s", filename.c_str());
        includer.releaseInclude(res);
    }

    return token;
}